

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O2

Mat_<double> * cvlinspace(Mat_<double> *__return_storage_ptr__,double min_,double max_,int length)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  cv::Mat_<double>::Mat_(__return_storage_ptr__,1,length);
  lVar1 = *(long *)&__return_storage_ptr__->field_0x10;
  uVar2 = 0;
  uVar3 = (ulong)(uint)length;
  if (length < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    *(double *)(lVar1 + uVar2 * 8) =
         (double)(int)uVar2 * ((max_ - min_) / (double)(length + -1)) + min_;
  }
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> cvlinspace(double min_, double max_, int length) {
    auto cvmat = cv::Mat_<double>(1, length);
    for (int i = 0; i < length; i++) {
        cvmat(0, i) = ((max_ - min_) / (length - 1) * i) + min_;
    }
    return cvmat;
}